

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeCommandListCreate
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_command_list_desc_t *desc,
          ze_command_list_handle_t *phCommandList)

{
  object_t<_ze_command_list_handle_t_*> *poVar1;
  bad_alloc *anon_var_0;
  ze_pfnCommandListCreate_t pfnCreate;
  dditable_t *dditable;
  ze_command_list_handle_t *pp_Stack_30;
  ze_result_t result;
  ze_command_list_handle_t *phCommandList_local;
  ze_command_list_desc_t *desc_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  dditable._4_4_ = 0;
  pfnCreate = *(ze_pfnCommandListCreate_t *)(hContext + 8);
  if (*(code **)(pfnCreate + 0x210) == (code *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hDevice_local = *(ze_device_handle_t *)hContext;
    desc_local = *(ze_command_list_desc_t **)hDevice;
    pp_Stack_30 = phCommandList;
    phCommandList_local = (ze_command_list_handle_t *)desc;
    dditable._4_4_ = (**(code **)(pfnCreate + 0x210))(hDevice_local,desc_local,desc,phCommandList);
    hContext_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      poVar1 = singleton_factory_t<object_t<_ze_command_list_handle_t*>,_ze_command_list_handle_t*>
               ::getInstance<_ze_command_list_handle_t*&,dditable_t*&>
                         (context,pp_Stack_30,(dditable_t **)&pfnCreate);
      *pp_Stack_30 = (ze_command_list_handle_t)poVar1;
      hContext_local._4_4_ = dditable._4_4_;
    }
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListCreate(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object
        const ze_command_list_desc_t* desc,             ///< [in] pointer to command list descriptor
        ze_command_list_handle_t* phCommandList         ///< [out] pointer to handle of command list object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_context_object_t*>( hContext )->dditable;
        auto pfnCreate = dditable->ze.CommandList.pfnCreate;
        if( nullptr == pfnCreate )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hContext = reinterpret_cast<ze_context_object_t*>( hContext )->handle;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<ze_device_object_t*>( hDevice )->handle;

        // forward to device-driver
        result = pfnCreate( hContext, hDevice, desc, phCommandList );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phCommandList = reinterpret_cast<ze_command_list_handle_t>(
                context->ze_command_list_factory.getInstance( *phCommandList, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }